

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

HaI32 __thiscall dgPolyhedra::GetFaceCount(dgPolyhedra *this)

{
  HaI32 HVar1;
  dgEdge *pdVar2;
  int iVar3;
  Iterator local_28;
  
  local_28.m_tree = &this->super_dgTree<dgEdge,_long>;
  HVar1 = IncLRU(this);
  local_28.m_ptr =
       &dgTree<dgEdge,_long>::Minimum(&this->super_dgTree<dgEdge,_long>)->super_dgRedBackNode;
  iVar3 = 0;
  while ((dgTreeNode *)local_28.m_ptr != (dgTreeNode *)0x0) {
    if ((((dgEdge *)((long)local_28.m_ptr + 0x28))->m_mark != HVar1) &&
       (-1 < ((dgEdge *)((long)local_28.m_ptr + 0x28))->m_incidentFace)) {
      pdVar2 = (dgEdge *)((long)local_28.m_ptr + 0x28);
      do {
        pdVar2->m_mark = HVar1;
        pdVar2 = pdVar2->m_next;
      } while (pdVar2 != (dgEdge *)((long)local_28.m_ptr + 0x28));
      iVar3 = iVar3 + 1;
    }
    dgTree<dgEdge,_long>::Iterator::operator++(&local_28,0);
  }
  return iVar3;
}

Assistant:

hacd::HaI32 dgPolyhedra::GetFaceCount() const
{
	Iterator iter (*this);
	hacd::HaI32 count = 0;
	hacd::HaI32 mark = IncLRU();
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);
		if (edge->m_mark == mark) {
			continue;
		}

		if (edge->m_incidentFace < 0) {
			continue;
		}

		count ++;
		dgEdge* ptr = edge;
		do {
			ptr->m_mark = mark;
			ptr = ptr->m_next;
		} while (ptr != edge);
	}
	return count;
}